

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spell_corrector.cpp
# Opt level: O2

wstring * __thiscall
NJamSpell::TSpellCorrector::FixFragment
          (wstring *__return_storage_ptr__,TSpellCorrector *this,wstring *text)

{
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *__rhs;
  long lVar1;
  size_t sVar2;
  pointer pTVar3;
  bool bVar4;
  pointer pwVar5;
  size_t position;
  ulong uVar6;
  wchar_t wVar7;
  size_t k;
  long *plVar8;
  pointer pwVar9;
  long lVar10;
  ulong uVar11;
  undefined1 local_150 [8];
  wstring lowered;
  wstring origLowered;
  TSentences origSentences;
  TSentences sentences;
  TWords candidates;
  wstring newWord;
  wstring origWord;
  undefined1 local_60 [8];
  TWords words;
  
  TLangModel::Tokenize((TSentences *)((long)&origLowered.field_2 + 8),&this->LangModel,text);
  std::__cxx11::wstring::wstring((wstring *)local_150,(wstring *)text);
  ToLower((wstring *)local_150);
  TLangModel::Tokenize
            ((TSentences *)
             &origSentences.
              super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,&this->LangModel,
             (wstring *)local_150);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  uVar6 = 0;
  uVar11 = 0;
  while( true ) {
    wVar7 = (wchar_t)__return_storage_ptr__;
    if ((ulong)(((long)sentences.
                       super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start -
                (long)origSentences.
                      super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) / 0x18) <= uVar6) break;
    std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::vector
              ((vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)local_60,
               origSentences.
               super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage + uVar6);
    plVar8 = (long *)(uVar6 * 0x18 + origLowered.field_2._8_8_);
    position = 0;
    while( true ) {
      if ((ulong)((long)words.
                        super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
                        _M_impl.super__Vector_impl_data._M_start - (long)local_60 >> 4) <= position)
      break;
      lVar1 = *plVar8;
      words.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = *(pointer *)(lVar1 + position * 0x10);
      lVar1 = *(long *)(lVar1 + 8 + position * 0x10);
      origWord.field_2._8_8_ = ((pointer)((long)local_60 + position * 0x10))->Ptr;
      sVar2 = ((pointer)((long)local_60 + position * 0x10))->Len;
      GetCandidatesRaw((TWords *)
                       &sentences.
                        super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,this,(TWords *)local_60,
                       position);
      if (candidates.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl
          .super__Vector_impl_data._M_start !=
          (pointer)sentences.
                   super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        pTVar3 = ((sentences.
                   super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                 super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        ((pointer)((long)local_60 + position * 0x10))->Ptr =
             (wchar_t *)
             ((sentences.
               super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage)->
             super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>)._M_impl.
             super__Vector_impl_data._M_start;
        ((pointer)((long)local_60 + position * 0x10))->Len = (size_t)pTVar3;
      }
      lVar10 = (long)words.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage -
               (long)(text->_M_dataplus)._M_p;
      for (; uVar11 < (ulong)(lVar10 >> 2); uVar11 = uVar11 + 1) {
        std::__cxx11::wstring::push_back(wVar7);
      }
      candidates.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)&newWord._M_string_length;
      std::__cxx11::wstring::_M_construct<wchar_t_const*>
                ((wstring *)
                 &candidates.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 ((pointer)((long)local_60 + position * 0x10))->Ptr,
                 ((pointer)((long)local_60 + position * 0x10))->Ptr +
                 ((pointer)((long)local_60 + position * 0x10))->Len);
      newWord.field_2._8_8_ = &origWord._M_string_length;
      std::__cxx11::wstring::_M_construct<wchar_t_const*>
                ((wstring *)((long)&newWord.field_2 + 8),
                 words.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage,
                 (long)&(words.
                         super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage)->Ptr + lVar1 * 4);
      lowered.field_2._8_8_ = &origLowered._M_string_length;
      __rhs = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
              ((long)&lowered.field_2 + 8);
      std::__cxx11::wstring::_M_construct<wchar_t_const*>
                ((wstring *)__rhs,origWord.field_2._8_8_,origWord.field_2._8_8_ + sVar2 * 4);
      bVar4 = std::operator!=((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                               *)&candidates.
                                  super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,__rhs);
      if (bVar4) {
        for (pwVar9 = (pointer)0x0; pwVar9 < newWord._M_dataplus._M_p;
            pwVar9 = (pointer)((long)pwVar9 + 1)) {
          pwVar5 = origWord._M_dataplus._M_p - 1;
          if (pwVar9 < origWord._M_dataplus._M_p) {
            pwVar5 = pwVar9;
          }
          MakeUpperIfRequired(*(wchar_t *)
                               ((long)&(candidates.
                                        super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage)->Ptr +
                               (long)pwVar9 * 4),
                              *(wchar_t *)(newWord.field_2._8_8_ + (long)pwVar5 * 4));
          std::__cxx11::wstring::push_back(wVar7);
        }
      }
      else {
        std::__cxx11::wstring::append((wstring *)__return_storage_ptr__);
      }
      uVar11 = uVar11 + lVar1;
      std::__cxx11::wstring::~wstring((wstring *)((long)&lowered.field_2 + 8));
      std::__cxx11::wstring::~wstring((wstring *)((long)&newWord.field_2 + 8));
      std::__cxx11::wstring::~wstring
                ((wstring *)
                 &candidates.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::_Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::~_Vector_base
                ((_Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)
                 &sentences.
                  super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      position = position + 1;
    }
    std::_Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::~_Vector_base
              ((_Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)local_60);
    uVar6 = uVar6 + 1;
  }
  for (; uVar11 < text->_M_string_length; uVar11 = uVar11 + 1) {
    std::__cxx11::wstring::push_back(wVar7);
  }
  std::
  vector<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
  ::~vector((vector<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
             *)&origSentences.
                super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::wstring::~wstring((wstring *)local_150);
  std::
  vector<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
  ::~vector((vector<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
             *)((long)&origLowered.field_2 + 8));
  return __return_storage_ptr__;
}

Assistant:

std::wstring TSpellCorrector::FixFragment(const std::wstring& text) const {
    TSentences origSentences = LangModel.Tokenize(text);
    std::wstring lowered = text;
    ToLower(lowered);
    TSentences sentences = LangModel.Tokenize(lowered);
    std::wstring result;
    size_t origPos = 0;
    for (size_t i = 0; i < sentences.size(); ++i) {
        TWords words = sentences[i];
        const TWords& origWords = origSentences[i];
        for (size_t j = 0; j < words.size(); ++j) {
            TWord orig = origWords[j];
            TWord lowered = words[j];
            TWords candidates = GetCandidatesRaw(words, j);
            if (candidates.size() > 0) {
                words[j] = candidates[0];
            }
            size_t currOrigPos = orig.Ptr - &text[0];
            while (origPos < currOrigPos) {
                result.push_back(text[origPos]);
                origPos += 1;
            }
            std::wstring newWord = std::wstring(words[j].Ptr, words[j].Len);
            std::wstring origWord = std::wstring(orig.Ptr, orig.Len);
            std::wstring origLowered = std::wstring(lowered.Ptr, lowered.Len);
            if (newWord != origLowered) {
                for (size_t k = 0; k < newWord.size(); ++k) {
                    size_t n = k < origWord.size() ? k : origWord.size() - 1;
                    wchar_t newChar = newWord[k];
                    wchar_t origChar = origWord[n];
                    result.push_back(MakeUpperIfRequired(newChar, origChar));
                }
            } else {
                result += origWord;
            }
            origPos += orig.Len;
        }
    }
    while (origPos < text.size()) {
        result.push_back(text[origPos]);
        origPos += 1;
    }
    return result;
}